

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

ecs_entity_t find_child_in_table(ecs_table_t *table,char *name)

{
  char *__s1;
  char *__s1_00;
  _Bool _Var1;
  int32_t iVar2;
  int32_t iVar3;
  int iVar4;
  ecs_data_t *peVar5;
  void *pvVar6;
  ecs_entity_t *peVar7;
  char *cur_sym;
  char *cur_name;
  EcsName *names;
  ecs_column_t *column;
  int32_t count;
  int32_t i;
  ecs_data_t *data;
  int32_t name_index;
  char *name_local;
  ecs_table_t *table_local;
  
  iVar2 = ecs_type_index_of(table->type,6);
  if (iVar2 == -1) {
    table_local = (ecs_table_t *)0x0;
  }
  else {
    peVar5 = ecs_table_get_data(table);
    if ((peVar5 == (ecs_data_t *)0x0) || (peVar5->columns == (ecs_column_t *)0x0)) {
      table_local = (ecs_table_t *)0x0;
    }
    else {
      iVar3 = ecs_vector_count(peVar5->entities);
      if (iVar3 == 0) {
        table_local = (ecs_table_t *)0x0;
      }
      else {
        _Var1 = is_number(name);
        if (_Var1) {
          table_local = (ecs_table_t *)name_to_id(name);
        }
        else {
          pvVar6 = _ecs_vector_first(peVar5->columns[iVar2].data,0x18,0x10);
          for (column._4_4_ = 0; column._4_4_ < iVar3; column._4_4_ = column._4_4_ + 1) {
            __s1 = *(char **)((long)pvVar6 + (long)column._4_4_ * 0x18);
            __s1_00 = *(char **)((long)pvVar6 + (long)column._4_4_ * 0x18 + 8);
            if (((__s1 != (char *)0x0) && (iVar4 = strcmp(__s1,name), iVar4 == 0)) ||
               ((__s1_00 != (char *)0x0 && (iVar4 = strcmp(__s1_00,name), iVar4 == 0)))) {
              peVar7 = (ecs_entity_t *)_ecs_vector_get(peVar5->entities,8,0x10,column._4_4_);
              return *peVar7;
            }
          }
          table_local = (ecs_table_t *)0x0;
        }
      }
    }
  }
  return (ecs_entity_t)table_local;
}

Assistant:

static
ecs_entity_t find_child_in_table(
    ecs_table_t *table,
    const char *name)
{
    /* If table doesn't have EcsName, then don't bother */
    int32_t name_index = ecs_type_index_of(table->type, ecs_typeid(EcsName));
    if (name_index == -1) {
        return 0;
    }

    ecs_data_t *data = ecs_table_get_data(table);
    if (!data || !data->columns) {
        return 0;
    }

    int32_t i, count = ecs_vector_count(data->entities);
    if (!count) {
        return 0;
    }

    if (is_number(name)) {
        return name_to_id(name);
    }

    ecs_column_t *column = &data->columns[name_index];
    EcsName *names = ecs_vector_first(column->data, EcsName);

    for (i = 0; i < count; i ++) {
        const char *cur_name = names[i].value;
        const char *cur_sym = names[i].symbol;
        if ((cur_name && !strcmp(cur_name, name)) || (cur_sym && !strcmp(cur_sym, name))) {
            return *ecs_vector_get(data->entities, ecs_entity_t, i);
        }
    }

    return 0;
}